

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

Integer pnga_sprs_array_create_from_dense(Integer g_a,Integer idx_size,Integer trans)

{
  float fVar1;
  bool bVar2;
  logical lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  Integer lo [2];
  Integer hi [2];
  int _val;
  void *vptr;
  Integer ld;
  int local_b8;
  undefined4 uStack_b4;
  int local_b0;
  undefined4 uStack_ac;
  long local_a8;
  long local_a0;
  Integer local_90;
  Integer local_88;
  Integer local_80;
  undefined8 local_78;
  double dStack_70;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  Integer local_38;
  
  lVar4 = g_a + 1000;
  lVar8 = (long)GA[lVar4].p_handle;
  local_80 = trans;
  local_90 = pnga_pgroup_nodeid(lVar8);
  iVar10 = GA[lVar4].type;
  local_50 = (long)_ga_sync_begin;
  local_48 = (long)_ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (local_50 != 0) {
    pnga_pgroup_sync(lVar8);
  }
  local_40 = lVar8;
  if (GA[lVar4].ndim != 2) {
    pnga_error("(ga_sprs_array_create_from_dense) global array must be of dimension 2",0);
  }
  local_88 = pnga_sprs_array_create
                       (GA[lVar4].dims[local_80 != 0],GA[lVar4].dims[local_80 == 0],(long)iVar10,
                        idx_size);
  pnga_distribution(g_a,(long)(int)local_90,(Integer *)&local_b8,&local_a8);
  pnga_access_ptr(g_a,(Integer *)&local_b8,&local_a8,&local_60,&local_38);
  if (idx_size == 4) {
    switch(iVar10 + -0x3e9) {
    case 0:
      if (CONCAT44(uStack_ac,local_b0) <= local_a0) {
        local_90 = (local_a8 - CONCAT44(uStack_b4,local_b8)) + 1 << 0x20;
        lVar4 = local_a8;
        lVar8 = local_a0;
        lVar5 = CONCAT44(uStack_ac,local_b0);
        do {
          lVar9 = CONCAT44(uStack_b4,local_b8);
          if (lVar9 <= lVar4) {
            lVar11 = (lVar9 << 0x20) + (lVar5 - CONCAT44(uStack_ac,local_b0)) * local_90;
            do {
              iVar10 = *(int *)(local_60 +
                               (CONCAT44(uStack_b4,local_b8) * -0x100000000 + lVar11 >> 0x1e));
              local_78 = (double)CONCAT44(local_78._4_4_,iVar10);
              if ((lVar5 == lVar9) || (iVar10 != 0)) {
                lVar8 = lVar5;
                lVar4 = lVar9;
                if (local_80 == 0) {
                  lVar8 = lVar9;
                  lVar4 = lVar5;
                }
                pnga_sprs_array_add_element(local_88,lVar8 + -1,lVar4 + -1,&local_78);
                lVar4 = local_a8;
              }
              lVar11 = lVar11 + 0x100000000;
              bVar2 = lVar9 < lVar4;
              lVar8 = local_a0;
              lVar9 = lVar9 + 1;
            } while (bVar2);
          }
          bVar2 = lVar5 < lVar8;
          lVar5 = lVar5 + 1;
        } while (bVar2);
      }
      break;
    case 1:
      if (CONCAT44(uStack_ac,local_b0) <= local_a0) {
        local_90 = (local_a8 - CONCAT44(uStack_b4,local_b8)) + 1 << 0x20;
        lVar4 = local_a8;
        lVar8 = local_a0;
        lVar5 = CONCAT44(uStack_ac,local_b0);
        do {
          lVar9 = CONCAT44(uStack_b4,local_b8);
          if (lVar9 <= lVar4) {
            lVar11 = (lVar9 << 0x20) + (lVar5 - CONCAT44(uStack_ac,local_b0)) * local_90;
            do {
              local_78 = *(double *)
                          (local_60 + (CONCAT44(uStack_b4,local_b8) * -0x100000000 + lVar11 >> 0x1d)
                          );
              if ((lVar5 == lVar9) || (local_78 != 0.0)) {
                lVar8 = lVar5;
                lVar4 = lVar9;
                if (local_80 == 0) {
                  lVar8 = lVar9;
                  lVar4 = lVar5;
                }
                pnga_sprs_array_add_element(local_88,lVar8 + -1,lVar4 + -1,&local_78);
                lVar4 = local_a8;
              }
              lVar11 = lVar11 + 0x100000000;
              bVar2 = lVar9 < lVar4;
              lVar8 = local_a0;
              lVar9 = lVar9 + 1;
            } while (bVar2);
          }
          bVar2 = lVar5 < lVar8;
          lVar5 = lVar5 + 1;
        } while (bVar2);
      }
      break;
    case 2:
      if (CONCAT44(uStack_ac,local_b0) <= local_a0) {
        local_90 = (local_a8 - CONCAT44(uStack_b4,local_b8)) + 1 << 0x20;
        lVar4 = local_a8;
        lVar8 = local_a0;
        lVar5 = CONCAT44(uStack_ac,local_b0);
        do {
          lVar9 = CONCAT44(uStack_b4,local_b8);
          if (lVar9 <= lVar4) {
            lVar11 = (lVar9 << 0x20) + (lVar5 - CONCAT44(uStack_ac,local_b0)) * local_90;
            do {
              fVar13 = *(float *)(local_60 +
                                 (CONCAT44(uStack_b4,local_b8) * -0x100000000 + lVar11 >> 0x1e));
              local_78 = (double)CONCAT44(local_78._4_4_,fVar13);
              if (((lVar5 == lVar9) || (fVar13 != 0.0)) || (NAN(fVar13))) {
                lVar8 = lVar5;
                lVar4 = lVar9;
                if (local_80 == 0) {
                  lVar8 = lVar9;
                  lVar4 = lVar5;
                }
                pnga_sprs_array_add_element(local_88,lVar8 + -1,lVar4 + -1,&local_78);
                lVar4 = local_a8;
              }
              lVar11 = lVar11 + 0x100000000;
              bVar2 = lVar9 < lVar4;
              lVar8 = local_a0;
              lVar9 = lVar9 + 1;
            } while (bVar2);
          }
          bVar2 = lVar5 < lVar8;
          lVar5 = lVar5 + 1;
        } while (bVar2);
      }
      break;
    case 3:
      if (CONCAT44(uStack_ac,local_b0) <= local_a0) {
        local_90 = (local_a8 - CONCAT44(uStack_b4,local_b8)) + 1 << 0x20;
        lVar4 = local_a8;
        lVar8 = local_a0;
        lVar5 = CONCAT44(uStack_ac,local_b0);
        do {
          lVar9 = CONCAT44(uStack_b4,local_b8);
          if (lVar9 <= lVar4) {
            lVar11 = (lVar9 << 0x20) + (lVar5 - CONCAT44(uStack_ac,local_b0)) * local_90;
            do {
              local_78 = *(double *)
                          (local_60 + (CONCAT44(uStack_b4,local_b8) * -0x100000000 + lVar11 >> 0x1d)
                          );
              if (((lVar5 == lVar9) || (local_78 != 0.0)) || (NAN(local_78))) {
                lVar8 = lVar5;
                lVar4 = lVar9;
                if (local_80 == 0) {
                  lVar8 = lVar9;
                  lVar4 = lVar5;
                }
                pnga_sprs_array_add_element(local_88,lVar8 + -1,lVar4 + -1,&local_78);
                lVar4 = local_a8;
              }
              lVar11 = lVar11 + 0x100000000;
              bVar2 = lVar9 < lVar4;
              lVar8 = local_a0;
              lVar9 = lVar9 + 1;
            } while (bVar2);
          }
          bVar2 = lVar5 < lVar8;
          lVar5 = lVar5 + 1;
        } while (bVar2);
      }
      break;
    default:
switchD_0014df1e_caseD_4:
      pnga_error("(ga_sprs_array_create_from_dense) Unknown datatype encountered",(long)iVar10);
      break;
    case 5:
      if (CONCAT44(uStack_ac,local_b0) <= local_a0) {
        local_90 = CONCAT44(local_90._4_4_,(((int)local_a8 - local_b8) + 1) * 2);
        lVar4 = local_a8;
        lVar8 = local_a0;
        lVar5 = CONCAT44(uStack_ac,local_b0);
        do {
          if (CONCAT44(uStack_b4,local_b8) <= lVar4) {
            iVar10 = ((int)lVar5 - local_b0) * (int)local_90 + local_b8 * 2;
            lVar9 = CONCAT44(uStack_b4,local_b8);
            do {
              iVar6 = iVar10 + local_b8 * -2;
              fVar13 = *(float *)(local_60 + (long)iVar6 * 4);
              fVar1 = *(float *)(local_60 + (long)(iVar6 + 1) * 4);
              local_78 = (double)CONCAT44(fVar1,fVar13);
              if (((lVar5 == lVar9) || (fVar13 != 0.0)) ||
                 ((NAN(fVar13) || ((fVar1 != 0.0 || (NAN(fVar1))))))) {
                lVar8 = lVar5;
                lVar4 = lVar9;
                if (local_80 == 0) {
                  lVar8 = lVar9;
                  lVar4 = lVar5;
                }
                pnga_sprs_array_add_element(local_88,lVar8 + -1,lVar4 + -1,&local_78);
                lVar4 = local_a8;
              }
              iVar10 = iVar10 + 2;
              bVar2 = lVar9 < lVar4;
              lVar8 = local_a0;
              lVar9 = lVar9 + 1;
            } while (bVar2);
          }
          bVar2 = lVar5 < lVar8;
          lVar5 = lVar5 + 1;
        } while (bVar2);
      }
      break;
    case 6:
      if (CONCAT44(uStack_ac,local_b0) <= local_a0) {
        local_90 = CONCAT44(local_90._4_4_,(((int)local_a8 - local_b8) + 1) * 2);
        lVar4 = local_a8;
        lVar8 = local_a0;
        lVar5 = CONCAT44(uStack_ac,local_b0);
        do {
          if (CONCAT44(uStack_b4,local_b8) <= lVar4) {
            iVar10 = ((int)lVar5 - local_b0) * (int)local_90 + local_b8 * 2;
            lVar9 = CONCAT44(uStack_b4,local_b8);
            do {
              iVar6 = iVar10 + local_b8 * -2;
              local_78 = *(double *)(local_60 + (long)iVar6 * 8);
              dStack_70 = *(double *)(local_60 + (long)(iVar6 + 1) * 8);
              if ((((lVar5 == lVar9) || (local_78 != 0.0)) || (NAN(local_78))) ||
                 ((dStack_70 != 0.0 || (NAN(dStack_70))))) {
                lVar8 = lVar5;
                lVar4 = lVar9;
                if (local_80 == 0) {
                  lVar8 = lVar9;
                  lVar4 = lVar5;
                }
                pnga_sprs_array_add_element(local_88,lVar8 + -1,lVar4 + -1,&local_78);
                lVar4 = local_a8;
              }
              iVar10 = iVar10 + 2;
              bVar2 = lVar9 < lVar4;
              lVar8 = local_a0;
              lVar9 = lVar9 + 1;
            } while (bVar2);
          }
          bVar2 = lVar5 < lVar8;
          lVar5 = lVar5 + 1;
        } while (bVar2);
      }
      break;
    case 0xf:
      if (CONCAT44(uStack_ac,local_b0) <= local_a0) {
        local_90 = (local_a8 - CONCAT44(uStack_b4,local_b8)) + 1 << 0x20;
        lVar4 = local_a8;
        lVar8 = local_a0;
        lVar5 = CONCAT44(uStack_ac,local_b0);
        do {
          lVar9 = CONCAT44(uStack_b4,local_b8);
          if (lVar9 <= lVar4) {
            lVar11 = (lVar9 << 0x20) + (lVar5 - CONCAT44(uStack_ac,local_b0)) * local_90;
            do {
              local_78 = *(double *)
                          (local_60 + (CONCAT44(uStack_b4,local_b8) * -0x100000000 + lVar11 >> 0x1d)
                          );
              if ((lVar5 == lVar9) || (local_78 != 0.0)) {
                lVar8 = lVar5;
                lVar4 = lVar9;
                if (local_80 == 0) {
                  lVar8 = lVar9;
                  lVar4 = lVar5;
                }
                pnga_sprs_array_add_element(local_88,lVar8 + -1,lVar4 + -1,&local_78);
                lVar4 = local_a8;
              }
              lVar11 = lVar11 + 0x100000000;
              bVar2 = lVar9 < lVar4;
              lVar8 = local_a0;
              lVar9 = lVar9 + 1;
            } while (bVar2);
          }
          bVar2 = lVar5 < lVar8;
          lVar5 = lVar5 + 1;
        } while (bVar2);
      }
    }
  }
  else {
    switch(iVar10 + -0x3e9) {
    case 0:
      if (CONCAT44(uStack_ac,local_b0) <= local_a0) {
        lVar4 = local_a8 - CONCAT44(uStack_b4,local_b8);
        lVar8 = local_a8;
        lVar5 = local_a0;
        lVar9 = CONCAT44(uStack_ac,local_b0);
        do {
          if (CONCAT44(uStack_b4,local_b8) <= lVar8) {
            lVar11 = CONCAT44(uStack_ac,local_b0);
            lVar12 = CONCAT44(uStack_b4,local_b8);
            do {
              iVar10 = *(int *)((lVar9 - lVar11) * (lVar4 + 1) * 4 + local_60 +
                                CONCAT44(uStack_b4,local_b8) * -4 + lVar12 * 4);
              local_78 = (double)CONCAT44(local_78._4_4_,iVar10);
              if ((lVar9 == lVar12) || (iVar10 != 0)) {
                lVar5 = lVar9;
                lVar8 = lVar12;
                if (local_80 == 0) {
                  lVar5 = lVar12;
                  lVar8 = lVar9;
                }
                pnga_sprs_array_add_element(local_88,lVar5 + -1,lVar8 + -1,&local_78);
                lVar8 = local_a8;
              }
              bVar2 = lVar12 < lVar8;
              lVar5 = local_a0;
              lVar12 = lVar12 + 1;
            } while (bVar2);
          }
          bVar2 = lVar9 < lVar5;
          lVar9 = lVar9 + 1;
        } while (bVar2);
      }
      break;
    case 1:
      if (CONCAT44(uStack_ac,local_b0) <= local_a0) {
        lVar4 = local_a8 - CONCAT44(uStack_b4,local_b8);
        lVar8 = local_a8;
        lVar5 = local_a0;
        lVar9 = CONCAT44(uStack_ac,local_b0);
        do {
          if (CONCAT44(uStack_b4,local_b8) <= lVar8) {
            lVar11 = CONCAT44(uStack_ac,local_b0);
            lVar12 = CONCAT44(uStack_b4,local_b8);
            do {
              local_78 = *(double *)
                          ((lVar9 - lVar11) * (lVar4 + 1) * 8 + local_60 +
                           CONCAT44(uStack_b4,local_b8) * -8 + lVar12 * 8);
              if ((lVar9 == lVar12) || (local_78 != 0.0)) {
                lVar5 = lVar12;
                lVar8 = lVar9;
                if (local_80 == 0) {
                  lVar5 = lVar9;
                  lVar8 = lVar12;
                }
                pnga_sprs_array_add_element(local_88,lVar8 + -1,lVar5 + -1,&local_78);
                lVar8 = local_a8;
              }
              bVar2 = lVar12 < lVar8;
              lVar5 = local_a0;
              lVar12 = lVar12 + 1;
            } while (bVar2);
          }
          bVar2 = lVar9 < lVar5;
          lVar9 = lVar9 + 1;
        } while (bVar2);
      }
      break;
    case 2:
      if (CONCAT44(uStack_ac,local_b0) <= local_a0) {
        lVar4 = local_a8 - CONCAT44(uStack_b4,local_b8);
        lVar8 = local_a8;
        lVar5 = local_a0;
        lVar9 = CONCAT44(uStack_ac,local_b0);
        do {
          if (CONCAT44(uStack_b4,local_b8) <= lVar8) {
            lVar11 = CONCAT44(uStack_ac,local_b0);
            lVar12 = CONCAT44(uStack_b4,local_b8);
            do {
              fVar13 = *(float *)((lVar9 - lVar11) * (lVar4 + 1) * 4 + local_60 +
                                  CONCAT44(uStack_b4,local_b8) * -4 + lVar12 * 4);
              local_78 = (double)CONCAT44(local_78._4_4_,fVar13);
              if (((lVar9 == lVar12) || (fVar13 != 0.0)) || (NAN(fVar13))) {
                lVar5 = lVar12;
                lVar8 = lVar9;
                if (local_80 == 0) {
                  lVar5 = lVar9;
                  lVar8 = lVar12;
                }
                pnga_sprs_array_add_element(local_88,lVar8 + -1,lVar5 + -1,&local_78);
                lVar8 = local_a8;
              }
              bVar2 = lVar12 < lVar8;
              lVar5 = local_a0;
              lVar12 = lVar12 + 1;
            } while (bVar2);
          }
          bVar2 = lVar9 < lVar5;
          lVar9 = lVar9 + 1;
        } while (bVar2);
      }
      break;
    case 3:
      if (CONCAT44(uStack_ac,local_b0) <= local_a0) {
        lVar4 = local_a8 - CONCAT44(uStack_b4,local_b8);
        lVar8 = local_a8;
        lVar5 = local_a0;
        lVar9 = CONCAT44(uStack_ac,local_b0);
        do {
          if (CONCAT44(uStack_b4,local_b8) <= lVar8) {
            lVar11 = CONCAT44(uStack_ac,local_b0);
            lVar12 = CONCAT44(uStack_b4,local_b8);
            do {
              local_78 = *(double *)
                          ((lVar9 - lVar11) * (lVar4 + 1) * 8 + local_60 +
                           CONCAT44(uStack_b4,local_b8) * -8 + lVar12 * 8);
              if (((lVar9 == lVar12) || (local_78 != 0.0)) || (NAN(local_78))) {
                lVar5 = lVar12;
                lVar8 = lVar9;
                if (local_80 == 0) {
                  lVar5 = lVar9;
                  lVar8 = lVar12;
                }
                pnga_sprs_array_add_element(local_88,lVar8 + -1,lVar5 + -1,&local_78);
                lVar8 = local_a8;
              }
              bVar2 = lVar12 < lVar8;
              lVar5 = local_a0;
              lVar12 = lVar12 + 1;
            } while (bVar2);
          }
          bVar2 = lVar9 < lVar5;
          lVar9 = lVar9 + 1;
        } while (bVar2);
      }
      break;
    default:
      goto switchD_0014df1e_caseD_4;
    case 5:
      if (CONCAT44(uStack_ac,local_b0) <= local_a0) {
        local_90 = local_60;
        lVar4 = local_a8 - CONCAT44(uStack_b4,local_b8);
        lVar8 = local_a8;
        lVar5 = local_a0;
        lVar9 = CONCAT44(uStack_ac,local_b0);
        do {
          if (CONCAT44(uStack_b4,local_b8) <= lVar8) {
            lVar12 = (lVar9 - CONCAT44(uStack_ac,local_b0)) * (lVar4 + 1) * 8 + local_90;
            lVar11 = CONCAT44(uStack_b4,local_b8);
            do {
              local_78 = *(double *)(lVar12 + CONCAT44(uStack_b4,local_b8) * -8 + lVar11 * 8);
              fVar13 = (float)((ulong)local_78 >> 0x20);
              if (((lVar9 == lVar11) || (SUB84(local_78,0) != 0.0)) ||
                 ((NAN(SUB84(local_78,0)) || ((fVar13 != 0.0 || (NAN(fVar13))))))) {
                lVar5 = lVar11;
                lVar8 = lVar9;
                if (local_80 == 0) {
                  lVar5 = lVar9;
                  lVar8 = lVar11;
                }
                pnga_sprs_array_add_element(local_88,lVar8 + -1,lVar5 + -1,&local_78);
                lVar8 = local_a8;
              }
              bVar2 = lVar11 < lVar8;
              lVar5 = local_a0;
              lVar11 = lVar11 + 1;
            } while (bVar2);
          }
          bVar2 = lVar9 < lVar5;
          lVar9 = lVar9 + 1;
        } while (bVar2);
      }
      break;
    case 6:
      if (CONCAT44(uStack_ac,local_b0) <= local_a0) {
        local_90 = local_60;
        local_58 = ((local_a8 - CONCAT44(uStack_b4,local_b8)) + 1) * 0x10;
        lVar4 = local_a8;
        lVar8 = local_a0;
        lVar5 = CONCAT44(uStack_ac,local_b0);
        do {
          lVar9 = CONCAT44(uStack_b4,local_b8);
          if (lVar9 <= lVar4) {
            lVar11 = lVar9 * 0x10 + local_90 + (lVar5 - CONCAT44(uStack_ac,local_b0)) * local_58;
            do {
              pdVar7 = (double *)(lVar11 + CONCAT44(uStack_b4,local_b8) * -0x10);
              local_78 = *pdVar7;
              dStack_70 = pdVar7[1];
              if ((((lVar5 == lVar9) || (local_78 != 0.0)) || (NAN(local_78))) ||
                 ((dStack_70 != 0.0 || (NAN(dStack_70))))) {
                lVar8 = lVar9;
                lVar4 = lVar5;
                if (local_80 == 0) {
                  lVar8 = lVar5;
                  lVar4 = lVar9;
                }
                pnga_sprs_array_add_element(local_88,lVar4 + -1,lVar8 + -1,&local_78);
                lVar4 = local_a8;
              }
              lVar11 = lVar11 + 0x10;
              bVar2 = lVar9 < lVar4;
              lVar8 = local_a0;
              lVar9 = lVar9 + 1;
            } while (bVar2);
          }
          bVar2 = lVar5 < lVar8;
          lVar5 = lVar5 + 1;
        } while (bVar2);
      }
      break;
    case 0xf:
      if (CONCAT44(uStack_ac,local_b0) <= local_a0) {
        lVar4 = local_a8 - CONCAT44(uStack_b4,local_b8);
        lVar8 = local_a8;
        lVar5 = local_a0;
        lVar9 = CONCAT44(uStack_ac,local_b0);
        do {
          if (CONCAT44(uStack_b4,local_b8) <= lVar8) {
            lVar11 = CONCAT44(uStack_ac,local_b0);
            lVar12 = CONCAT44(uStack_b4,local_b8);
            do {
              local_78 = *(double *)
                          ((lVar9 - lVar11) * (lVar4 + 1) * 8 + local_60 +
                           CONCAT44(uStack_b4,local_b8) * -8 + lVar12 * 8);
              if ((lVar9 == lVar12) || (local_78 != 0.0)) {
                lVar5 = lVar12;
                lVar8 = lVar9;
                if (local_80 == 0) {
                  lVar5 = lVar9;
                  lVar8 = lVar12;
                }
                pnga_sprs_array_add_element(local_88,lVar8 + -1,lVar5 + -1,&local_78);
                lVar8 = local_a8;
              }
              bVar2 = lVar12 < lVar8;
              lVar5 = local_a0;
              lVar12 = lVar12 + 1;
            } while (bVar2);
          }
          bVar2 = lVar9 < lVar5;
          lVar9 = lVar9 + 1;
        } while (bVar2);
      }
    }
  }
  lVar4 = local_48;
  pnga_mask_sync(local_50,local_48);
  lVar3 = pnga_sprs_array_assemble(local_88);
  lVar8 = local_40;
  if (lVar3 == 0) {
    pnga_error("(ga_sprs_array_create_from_dense) failed to create sparse array from dense array",0)
    ;
  }
  if ((int)lVar4 != 0) {
    pnga_pgroup_sync(lVar8);
  }
  return local_88;
}

Assistant:

Integer pnga_sprs_array_create_from_dense(Integer g_a, Integer idx_size,
    Integer trans)
{
  Integer handle = g_a + GA_OFFSET, s_a;
  int local_sync_begin,local_sync_end;
  Integer i, j, idx, jdx, lo[2], hi[2], ld;
  Integer idim, jdim;
  int grp = GA[handle].p_handle;
  int me = (int)pnga_pgroup_nodeid(grp);
  void *vptr;
  int type = GA[handle].type;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* Check dimension */
  if (GA[handle].ndim != 2) {
    pnga_error("(ga_sprs_array_create_from_dense) global array"
        " must be of dimension 2",0);
  }
  if (trans) {
    idim = (Integer)GA[handle].dims[1];
    jdim = (Integer)GA[handle].dims[0];
  } else {
    idim = (Integer)GA[handle].dims[0];
    jdim = (Integer)GA[handle].dims[1];
  }

  /* create sparse array */
  s_a = pnga_sprs_array_create(idim, jdim, type, idx_size);
  /* find bounding indices of locally owned block from global array */
  pnga_distribution(g_a,me,lo,hi);
  /* get pointer to locally owned block */
  pnga_access_ptr(g_a, lo, hi, &vptr, &ld);
  /* add all non-zero entries from g_a to s_a. Add diagonal elements
   * to s_a even if they are zero */
  if (idx_size == 4) {
    if (type == C_INT) {
      SPRS_REAL_FILTER_M(int,int,vptr);
    } else if (type == C_LONG) {
      SPRS_REAL_FILTER_M(long,int,vptr);
    } else if (type == C_LONGLONG) {
      SPRS_REAL_FILTER_M(long long,int,vptr);
    } else if (type == C_FLOAT) {
      SPRS_REAL_FILTER_M(float,int,vptr);
    } else if (type == C_DBL) {
      SPRS_REAL_FILTER_M(double,int,vptr);
    } else if (type == C_SCPL) {
      SPRS_COMPLEX_FILTER_M(float,int,vptr);
    } else if (type == C_DCPL) {
      SPRS_COMPLEX_FILTER_M(double,int,vptr);
    } else {
      pnga_error("(ga_sprs_array_create_from_dense) Unknown datatype"
          " encountered",type);
    }
  } else {
    if (type == C_INT) {
      SPRS_REAL_FILTER_M(int,int64_t,vptr);
    } else if (type == C_LONG) {
      SPRS_REAL_FILTER_M(long,int64_t,vptr);
    } else if (type == C_LONGLONG) {
      SPRS_REAL_FILTER_M(long long,int64_t,vptr);
    } else if (type == C_FLOAT) {
      SPRS_REAL_FILTER_M(float,int64_t,vptr);
    } else if (type == C_DBL) {
      SPRS_REAL_FILTER_M(double,int64_t,vptr);
    } else if (type == C_SCPL) {
      SPRS_COMPLEX_FILTER_M(float,int64_t,vptr);
    } else if (type == C_DCPL) {
      SPRS_COMPLEX_FILTER_M(double,int64_t,vptr);
    } else {
      pnga_error("(ga_sprs_array_create_from_dense) Unknown datatype"
          " encountered",type);
    }
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_sprs_array_assemble(s_a)) {
    pnga_error("(ga_sprs_array_create_from_dense) failed to create"
        " sparse array from dense array",0);
  }
  if (local_sync_end) pnga_pgroup_sync(grp);
  return s_a;
}